

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O3

void map2json(void)

{
  map2json_t *obj;
  char *__s;
  char primitiveMethod [12];
  char local_18 [16];
  
  obj = map2json_init((char *)0x0);
  map2json_push(obj,"test._id.$oid","566950d1afc4a3c1d86fcdfb");
  map2json_push(obj,"test.name","picture");
  map2json_push(obj,"test.file","/var/www/html/pictureIn.png");
  map2json_push(obj,"test.array[0].mysubobject","value");
  map2json_push(obj,"test.array[0].secondobject","0");
  map2json_push(obj,"test.array[1]","1");
  map2json_push(obj,"test.array[2]","b");
  map2json_push(obj,"test.array[3]","3");
  map2json_push(obj,"test.array[4]","d");
  map2json_push(obj,"test.array[5].object","test");
  map2json_push(obj,"test.array[5].object2","test2");
  map2json_push(obj,"test.array[x]","6");
  map2json_push(obj,"test.nullpointer","null");
  map2json_push(obj,"test.number","1234");
  map2json_push(obj,"test.true","true");
  map2json_push(obj,"test.false","false");
  builtin_strncpy(local_18 + 8,"n()",4);
  builtin_strncpy(local_18,"\x1bfunctio",8);
  map2json_push(obj,"test.fakePrimitive",local_18);
  __s = map2json_create(obj);
  puts(__s);
  map2json_destroy(obj);
  return;
}

Assistant:

void map2json() {
	map2json_t *map2jsonObj = map2json_init(NULL);
	map2json_push(map2jsonObj, "test._id.$oid", "566950d1afc4a3c1d86fcdfb");
	map2json_push(map2jsonObj, "test.name", "picture");
	map2json_push(map2jsonObj, "test.file", "/var/www/html/pictureIn.png");
	map2json_push(map2jsonObj, "test.array[0].mysubobject", "value");
	map2json_push(map2jsonObj, "test.array[0].secondobject", "0");
	map2json_push(map2jsonObj, "test.array[1]", "1");
	map2json_push(map2jsonObj, "test.array[2]", "b");
	map2json_push(map2jsonObj, "test.array[3]", "3");
	map2json_push(map2jsonObj, "test.array[4]", "d");
	map2json_push(map2jsonObj, "test.array[5].object", "test");
	map2json_push(map2jsonObj, "test.array[5].object2", "test2");
	map2json_push(map2jsonObj, "test.array[x]", "6");
	map2json_push(map2jsonObj, "test.nullpointer", "null");
	map2json_push(map2jsonObj, "test.number", "1234");
	map2json_push(map2jsonObj, "test.true", "true");
	map2json_push(map2jsonObj, "test.false", "false");

	char primitiveMethod[] = " function()";
	*primitiveMethod = JSON2MAP_PRIMITIVE_PREFIXER;
	map2json_push(map2jsonObj, "test.fakePrimitive", primitiveMethod);

	printf("%s\n", map2json_create(map2jsonObj));

	map2json_destroy(map2jsonObj);
}